

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::directory_iterator::impl::~impl(impl *this)

{
  impl *this_local;
  
  if (this->_dir != (DIR *)0x0) {
    closedir((DIR *)this->_dir);
  }
  directory_entry::~directory_entry(&this->_dir_entry);
  filesystem::path::~path(&this->_base);
  return;
}

Assistant:

~impl()
    {
        if (_dir) {
            ::closedir(_dir);
        }
    }